

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O2

void MARGINAL::make_marginal<false>(data *sm,example *ec)

{
  features *pfVar1;
  float fVar2;
  double dVar3;
  byte bVar4;
  byte bVar5;
  vw *pvVar6;
  float *pfVar7;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  data *pdVar9;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this;
  features *pfVar10;
  features *pfVar11;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  iterator iVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  ostream *poVar15;
  long lVar16;
  long lVar17;
  uint64_t *puVar18;
  ulong i;
  float *pfVar19;
  features *pfVar20;
  uint64_t *puVar21;
  features *pfVar22;
  features *pfVar23;
  ulong *puVar24;
  byte bVar25;
  float fVar26;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false,_false>,_bool>
  pVar27;
  uint64_t key;
  data *local_100;
  byte *local_f8;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_f0;
  example *local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 uStack_d0;
  undefined4 local_cc;
  features *local_c8;
  features *local_c0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_b0;
  uint64_t local_a8;
  features *local_a0;
  uint64_t local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  
  bVar25 = 0;
  pvVar6 = sm->all;
  puVar18 = &(pvVar6->weights).dense_weights._weight_mask;
  if ((pvVar6->weights).sparse != false) {
    puVar18 = &(pvVar6->weights).sparse_weights._weight_mask;
  }
  local_a8 = *puVar18;
  local_c0 = (ec->super_example_predict).feature_space;
  sm->average_pred = 0.0;
  sm->net_weight = 0.0;
  sm->net_feature_weight = 0.0;
  sm->alg_loss = 0.0;
  local_f8 = (ec->super_example_predict).indices._begin;
  local_c8 = sm->temp;
  local_b0 = &(sm->marginals)._M_h;
  local_f0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&sm->expert_state;
  local_100 = sm;
  local_e8 = ec;
  do {
    pfVar11 = local_c0;
    pfVar10 = local_c8;
    if (local_f8 == (local_e8->super_example_predict).indices._end) {
      return;
    }
    bVar4 = *local_f8;
    if (local_100->id_features[bVar4] == true) {
      pfVar1 = local_c8 + bVar4;
      pfVar23 = local_c0 + bVar4;
      puVar18 = &local_98;
      pfVar20 = pfVar1;
      puVar21 = puVar18;
      for (lVar16 = 0xd; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar21 = (uint64_t)(pfVar20->values)._begin;
        pfVar20 = (features *)((long)pfVar20 + (ulong)bVar25 * -0x10 + 8);
        puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
      }
      lVar16 = 100;
      pfVar20 = pfVar23;
      pfVar22 = pfVar1;
      for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined1 *)&(pfVar22->values)._begin = *(undefined1 *)&(pfVar20->values)._begin;
        pfVar20 = (features *)((long)pfVar20 + (ulong)bVar25 * -2 + 1);
        pfVar22 = (features *)((long)pfVar22 + (ulong)bVar25 * -2 + 1);
      }
      for (; lVar16 != 0; lVar16 = lVar16 + -1) {
        *(char *)&(pfVar23->values)._begin = (char)*puVar18;
        puVar18 = (uint64_t *)((long)puVar18 + (ulong)bVar25 * -2 + 1);
        pfVar23 = (features *)((long)pfVar23 + (ulong)bVar25 * -2 + 1);
      }
      bVar5 = *local_f8;
      pfVar23 = local_c0 + bVar5;
      features::clear(pfVar23);
      local_b8 = &pfVar11[bVar5].space_names;
      puVar24 = pfVar10[bVar4].indicies._begin + 1;
      local_a0 = pfVar23;
      for (pfVar19 = pfVar10[bVar4].values._begin; this_00 = local_b0,
          pfVar7 = (pfVar1->values)._end, pfVar19 != pfVar7; pfVar19 = pfVar19 + 2) {
        if (pfVar19 + 1 == pfVar7) {
          poVar15 = std::operator<<((ostream *)&std::cout,"warning: id feature namespace has ");
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
          poVar15 = std::operator<<(poVar15," features. Should be a multiple of 2");
          std::endl<char,std::char_traits<char>>(poVar15);
          break;
        }
        if ((((*pfVar19 != 1.0) || (NAN(*pfVar19))) || (fVar26 = pfVar19[1], fVar26 != 1.0)) ||
           (NAN(fVar26))) {
          poVar15 = std::operator<<((ostream *)&std::cout,
                                    "warning: bad id features, must have value 1.");
          std::endl<char,std::char_traits<char>>(poVar15);
        }
        else {
          i = puVar24[-1] & local_a8;
          key = (*puVar24 & local_a8) + (local_e8->super_example_predict).ft_offset;
          iVar12 = std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(local_b0,&key);
          pdVar9 = local_100;
          if (iVar12.
              super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            local_90._0_4_ = local_100->initial_numerator;
            local_90._4_4_ = local_100->initial_denominator;
            local_98 = key;
            pVar27 = std::
                     _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_emplace<std::pair<unsigned_long,std::pair<float,float>>>
                               ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)this_00,&local_98);
            if (pdVar9->compete == true) {
              local_e0 = 0;
              local_d8 = 0x3f800000;
              local_d4 = 0;
              uStack_d0 = 0;
              local_cc = 0x3f800000;
              local_98 = key;
              local_80 = 0x3f80000000000000;
              local_90 = 0;
              local_88 = 0x3f800000;
              local_84 = 0;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                        (local_f0,&local_98,pVar27._8_8_);
            }
          }
          pmVar13 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_00,&key);
          dVar3 = pmVar13->first;
          pmVar13 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_00,&key);
          pfVar10 = local_a0;
          fVar26 = (float)(dVar3 / pmVar13->second);
          features::push_back(local_a0,fVar26,i);
          psVar8 = (pfVar1->space_names)._begin;
          if (psVar8 != (pfVar1->space_names)._end) {
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(local_b8,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)psVar8 +
                                    ((long)(pfVar10->values)._end - (long)(pfVar10->values)._begin)
                                    * 8 + -0x20));
          }
          this = local_f0;
          if (local_100->compete == true) {
            pmVar14 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_f0,&key);
            pdVar9 = local_100;
            fVar2 = (pmVar14->first).weight;
            local_100->average_pred = fVar26 * fVar2 + local_100->average_pred;
            local_100->net_weight = fVar2 + local_100->net_weight;
            pmVar14 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,&key);
            pdVar9->net_feature_weight = (pmVar14->second).weight + pdVar9->net_feature_weight;
          }
        }
        puVar24 = puVar24 + 2;
      }
    }
    local_f8 = local_f8 + 1;
  } while( true );
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}